

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall
CMU462::PathTracer::PathTracer
          (PathTracer *this,size_t ns_aa,size_t max_ray_depth,size_t ns_area_light,size_t ns_diff,
          size_t ns_glsy,size_t ns_refr,size_t num_threads,HDRImageBuffer *envmap)

{
  EnvironmentLight *this_00;
  Sampler2D *this_01;
  Sampler3D *this_02;
  size_t ns_glsy_local;
  size_t ns_diff_local;
  size_t ns_area_light_local;
  size_t max_ray_depth_local;
  size_t ns_aa_local;
  PathTracer *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->tile_samples);
  HDRImageBuffer::HDRImageBuffer(&this->sampleBuffer);
  ImageBuffer::ImageBuffer(&this->frameBuffer);
  Timer::Timer(&this->timer);
  std::vector<std::thread_*,_std::allocator<std::thread_*>_>::vector(&this->workerThreads);
  WorkQueue<CMU462::WorkItem>::WorkQueue(&this->workQueue);
  std::
  stack<CMU462::StaticScene::BVHNode*,std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>>
  ::
  stack<std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>,void>
            ((stack<CMU462::StaticScene::BVHNode*,std::deque<CMU462::StaticScene::BVHNode*,std::allocator<CMU462::StaticScene::BVHNode*>>>
              *)&this->selectionHistory);
  std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::vector(&this->rayLog);
  this->state = INIT;
  this->ns_aa = ns_aa;
  this->max_ray_depth = max_ray_depth;
  this->ns_area_light = ns_area_light;
  this->ns_diff = ns_diff;
  this->ns_glsy = ns_diff;
  this->ns_refr = ns_refr;
  if (envmap == (HDRImageBuffer *)0x0) {
    this->envLight = (EnvironmentLight *)0x0;
  }
  else {
    this_00 = (EnvironmentLight *)operator_new(0x10);
    StaticScene::EnvironmentLight::EnvironmentLight(this_00,envmap);
    this->envLight = this_00;
  }
  this->bvh = (BVHAccel *)0x0;
  this->scene = (Scene *)0x0;
  this->camera = (Camera *)0x0;
  this_01 = (Sampler2D *)operator_new(8);
  ((Sampler2D *)&this_01->_vptr_Sampler2D)->_vptr_Sampler2D = (_func_int **)0x0;
  UniformGridSampler2D::UniformGridSampler2D((UniformGridSampler2D *)this_01);
  this->gridSampler = this_01;
  this_02 = (Sampler3D *)operator_new(8);
  ((Sampler3D *)&this_02->_vptr_Sampler3D)->_vptr_Sampler3D = (_func_int **)0x0;
  UniformHemisphereSampler3D::UniformHemisphereSampler3D((UniformHemisphereSampler3D *)this_02);
  this->hemisphereSampler = this_02;
  this->show_rays = true;
  this->imageTileSize = 0x20;
  this->numWorkerThreads = num_threads;
  std::vector<std::thread_*,_std::allocator<std::thread_*>_>::resize
            (&this->workerThreads,this->numWorkerThreads);
  this->tm_gamma = 2.2;
  this->tm_level = 1.0;
  this->tm_key = 0.18;
  this->tm_wht = 5.0;
  return;
}

Assistant:

PathTracer::PathTracer(size_t ns_aa,
      size_t max_ray_depth, size_t ns_area_light,
      size_t ns_diff, size_t ns_glsy, size_t ns_refr,
      size_t num_threads, HDRImageBuffer* envmap) {
    state = INIT,
    this->ns_aa = ns_aa;
    this->max_ray_depth = max_ray_depth;
    this->ns_area_light = ns_area_light;
    this->ns_diff = ns_diff;
    this->ns_glsy = ns_diff;
    this->ns_refr = ns_refr;

    if (envmap) {
      this->envLight = new EnvironmentLight(envmap);
    } else {
      this->envLight = NULL;
    }

    bvh = NULL;
    scene = NULL;
    camera = NULL;

    gridSampler = new UniformGridSampler2D();
    hemisphereSampler = new UniformHemisphereSampler3D();

    show_rays = true;

    imageTileSize = 32;
    numWorkerThreads = num_threads;
    workerThreads.resize(numWorkerThreads);

    tm_gamma = 2.2f;
    tm_level = 1.0f;
    tm_key = 0.18;
    tm_wht = 5.0f;

  }